

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O2

void __thiscall gl3cts::ClipDistance::Utility::Program::~Program(Program *this)

{
  GLuint GVar1;
  
  GVar1 = (this->m_vertex_shader_status).shader_id;
  if (GVar1 != 0) {
    (*this->m_gl->deleteShader)(GVar1);
    (this->m_vertex_shader_status).shader_id = 0;
  }
  GVar1 = (this->m_fragment_shader_status).shader_id;
  if (GVar1 != 0) {
    (*this->m_gl->deleteShader)(GVar1);
    (this->m_fragment_shader_status).shader_id = 0;
  }
  GVar1 = (this->m_program_status).program_id;
  if (GVar1 != 0) {
    (*this->m_gl->deleteProgram)(GVar1);
    (this->m_program_status).program_id = 0;
  }
  std::__cxx11::string::~string((string *)&(this->m_program_status).program_linkage_log);
  std::__cxx11::string::~string((string *)&(this->m_fragment_shader_status).shader_log);
  std::__cxx11::string::~string((string *)&(this->m_vertex_shader_status).shader_log);
  return;
}

Assistant:

gl3cts::ClipDistance::Utility::Program::~Program()
{
	if (m_vertex_shader_status.shader_id)
	{
		m_gl.deleteShader(m_vertex_shader_status.shader_id);

		m_vertex_shader_status.shader_id = 0;
	}

	if (m_fragment_shader_status.shader_id)
	{
		m_gl.deleteShader(m_fragment_shader_status.shader_id);

		m_fragment_shader_status.shader_id = 0;
	}

	if (m_program_status.program_id)
	{
		m_gl.deleteProgram(m_program_status.program_id);

		m_program_status.program_id = 0;
	}
}